

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(void)

{
  size_type *psVar1;
  pointer pEVar2;
  istream *piVar3;
  ostream *poVar4;
  long lVar5;
  size_type __n;
  long lVar6;
  long lVar7;
  undefined1 local_80 [8];
  field_t field;
  pos_t pos;
  int KR;
  int KC;
  string ROW;
  bool back;
  bool explore;
  
  piVar3 = (istream *)std::istream::operator>>((istream *)&std::cin,&R);
  piVar3 = (istream *)std::istream::operator>>(piVar3,&C);
  std::istream::operator>>(piVar3,&A);
  std::istream::ignore();
  __n = (size_type)R;
  field.
  super__Vector_base<std::vector<ECell,_std::allocator<ECell>_>,_std::allocator<std::vector<ECell,_std::allocator<ECell>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0x3f;
  std::vector<ECell,_std::allocator<ECell>_>::vector
            ((vector<ECell,_std::allocator<ECell>_> *)&KR,(long)C,
             (value_type *)
             &field.
              super__Vector_base<std::vector<ECell,_std::allocator<ECell>_>,_std::allocator<std::vector<ECell,_std::allocator<ECell>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,(allocator_type *)&pos);
  std::
  vector<std::vector<ECell,_std::allocator<ECell>_>,_std::allocator<std::vector<ECell,_std::allocator<ECell>_>_>_>
  ::vector((vector<std::vector<ECell,_std::allocator<ECell>_>,_std::allocator<std::vector<ECell,_std::allocator<ECell>_>_>_>
            *)local_80,__n,(value_type *)&KR,(allocator_type *)&pos.second);
  if ((size_type *)_KR != (size_type *)0x0) {
    operator_delete(_KR,CONCAT71(ROW._M_string_length._1_7_,(undefined1)ROW._M_string_length) -
                        (long)_KR);
  }
  ROW.field_2._M_local_buf[0xe] = '\0';
  psVar1 = &ROW._M_string_length;
  do {
    piVar3 = (istream *)std::istream::operator>>((istream *)&std::cin,&pos.first);
    std::istream::operator>>(piVar3,&pos.second);
    std::istream::ignore();
    field.
    super__Vector_base<std::vector<ECell,_std::allocator<ECell>_>,_std::allocator<std::vector<ECell,_std::allocator<ECell>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = pos.first;
    field.
    super__Vector_base<std::vector<ECell,_std::allocator<ECell>_>,_std::allocator<std::vector<ECell,_std::allocator<ECell>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = pos.second;
    if (0 < R) {
      lVar6 = 0;
      do {
        ROW._M_dataplus._M_p = (pointer)0x0;
        ROW._M_string_length._0_1_ = 0;
        _KR = (pointer)psVar1;
        std::operator>>((istream *)&std::cin,(string *)&KR);
        std::istream::ignore();
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,_KR,(long)ROW._M_dataplus._M_p);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
        std::ostream::put((char)poVar4);
        std::ostream::flush();
        lVar5 = (long)C;
        if (0 < lVar5) {
          pEVar2 = (((pointer)((long)local_80 + lVar6 * 0x18))->
                   super__Vector_base<ECell,_std::allocator<ECell>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          lVar7 = 0;
          do {
            pEVar2[lVar7] = (int)_KR[lVar7];
            lVar7 = lVar7 + 1;
          } while (lVar5 != lVar7);
        }
        if ((size_type *)_KR != psVar1) {
          operator_delete(_KR,CONCAT71(ROW._M_string_length._1_7_,(undefined1)ROW._M_string_length)
                              + 1);
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 < R);
    }
    ROW.field_2._M_local_buf[0xf] = '\x01';
    step_abi_cxx11_((string *)&KR,(field_t *)local_80,
                    (pos_t *)&field.
                              super__Vector_base<std::vector<ECell,_std::allocator<ECell>_>,_std::allocator<std::vector<ECell,_std::allocator<ECell>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,
                    (bool *)(ROW.field_2._M_local_buf + 0xe),
                    (bool *)(ROW.field_2._M_local_buf + 0xf));
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,_KR,(long)ROW._M_dataplus._M_p);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    if ((size_type *)_KR != psVar1) {
      operator_delete(_KR,CONCAT71(ROW._M_string_length._1_7_,(undefined1)ROW._M_string_length) + 1)
      ;
    }
  } while( true );
}

Assistant:

int main()
{
    std::cin >> R >> C >> A;
    std::cin.ignore();

    pos_t start(-1, -1);
    bool first_step = true;
    
    field_t field(R, row_t(C, EC_UNKNOWN));
    bool back = false;
    // game loop
    while (1)
    {
        int KR; // row where Kirk is located.
        int KC; // column where Kirk is located.
        std::cin >> KR >> KC;
        std::cin.ignore();
        
        pos_t pos(KR, KC);
        pos_t end;

        for (int i = 0; i < R; i++)
        {
            std::string ROW; // C of the characters in '#.TC?' (i.e. one line of the ASCII maze).
            std::cin >> ROW;
            std::cin.ignore();
            
            std::cerr << ROW << std::endl;
            for (int j = 0; j < C; j++)
            {
                field[i][j] = static_cast<ECell>(ROW[j]);
                if (EC_START == ROW[j])
                {
                    if (first_step)
                    {
                        start = pos;
                        first_step = false;
                    }
                }
            }
        }
        
        bool explore = true;
        std::cout << step(field, pos, back, explore) << std::endl;
    }
}